

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell::
~TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell
          (TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell
           *this)

{
  TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell *this_local;
  
  ~TEST_MockParameterTest_ignoreOtherParametersButExpectedParameterDidntHappen_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersButExpectedParameterDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1).ignoreOtherParameters();
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters();
    mock().actualCall("foo").withParameter("p2", 2).withParameter("p3", 3).withParameter("p4", 4);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}